

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstract_factory_test.cc
# Opt level: O1

int main(void)

{
  pointer pcVar1;
  int iVar2;
  undefined8 *puVar3;
  SimpleFactory *this;
  Shape *pSVar4;
  long *plVar5;
  string name;
  long *local_58 [2];
  long local_48 [2];
  long *local_38 [2];
  long local_28 [2];
  
  puVar3 = (undefined8 *)operator_new(8);
  *puVar3 = &PTR_createCurvedInstance_00103d68;
  this = (SimpleFactory *)operator_new(8);
  (this->super_AbstractFactory)._vptr_AbstractFactory =
       (_func_int **)&PTR_createCurvedInstance_00103da8;
  pSVar4 = SimpleFactory::createCurvedInstance(this);
  pcVar1 = (pSVar4->value)._M_dataplus._M_p;
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_58,pcVar1,pcVar1 + (pSVar4->value)._M_string_length);
  iVar2 = std::__cxx11::string::compare((char *)local_58);
  if (iVar2 != 0) {
    __assert_fail("name == \"circle\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/KlotzAndrew[P]design-patterns-cpp/test/creational/abstract_factory_test.cc"
                  ,0xd,"int main()");
  }
  plVar5 = (long *)(**(code **)*puVar3)(puVar3);
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char*>((string *)local_38,*plVar5,plVar5[1] + *plVar5);
  std::__cxx11::string::operator=((string *)local_58,(string *)local_38);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  iVar2 = std::__cxx11::string::compare((char *)local_58);
  if (iVar2 == 0) {
    if (local_58[0] != local_48) {
      operator_delete(local_58[0],local_48[0] + 1);
    }
    return 0;
  }
  __assert_fail("name == \"ellipse\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/KlotzAndrew[P]design-patterns-cpp/test/creational/abstract_factory_test.cc"
                ,0x11,"int main()");
}

Assistant:

int main() {
  AbstractFactory *complexFactry = new ComplexFactory;
  AbstractFactory *simpleFactry = new SimpleFactory;

  Shape *simpleShape = simpleFactry->createCurvedInstance();
  std::string name = simpleShape->getValue();
  assert(name == "circle");

  Shape *complexShape = complexFactry->createCurvedInstance();
  name = complexShape->getValue();
  assert(name == "ellipse");
}